

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gridded_Data_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Gridded_Data_PDU::Gridded_Data_PDU
          (Gridded_Data_PDU *this,EntityIdentifier *EnvironmentalProcessID,KUINT16 FieldNumber,
          KUINT16 PduNum,KUINT16 PduTotal,CoordinateSystem CS,ConstantGrid CG,EnvironmentType *ET,
          EulerAngles *Ori,KUINT64 SampleTime)

{
  CoordinateSystem CS_local;
  KUINT16 PduTotal_local;
  KUINT16 PduNum_local;
  KUINT16 FieldNumber_local;
  EntityIdentifier *EnvironmentalProcessID_local;
  Gridded_Data_PDU *this_local;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Gridded_Data_PDU_0032d158;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EnvProcID,EnvironmentalProcessID);
  this->m_ui16FieldNum = FieldNumber;
  this->m_ui16PDUNum = PduNum;
  this->m_ui16PDUTotal = PduTotal;
  this->m_ui16CordSys = (KUINT16)CS;
  this->m_ui8NumAxis = '\0';
  this->m_ui8ConstGrid = (KUINT8)CG;
  DATA_TYPE::EnvironmentType::EnvironmentType(&this->m_EnvType,ET);
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_Ori,Ori);
  this->m_ui64SampleTime = SampleTime;
  this->m_ui32TotalValues = 0;
  this->m_ui8VecDim = '\0';
  this->m_ui16Padding1 = 0;
  this->m_ui8Padding1 = '\0';
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
  ::vector(&this->m_vpGridAxisDesc);
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
  ::vector(&this->m_vGridData);
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\t';
  (this->super_Header).super_Header6.m_ui8PDUType = '*';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x40;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

Gridded_Data_PDU::Gridded_Data_PDU( const EntityIdentifier & EnvironmentalProcessID, KUINT16 FieldNumber, KUINT16 PduNum,
                                    KUINT16 PduTotal, CoordinateSystem CS, ConstantGrid CG, const EnvironmentType & ET,
                                    const EulerAngles & Ori, KUINT64 SampleTime ) :
    m_EnvProcID( EnvironmentalProcessID ),
    m_ui16FieldNum( FieldNumber ),
    m_ui16PDUNum( PduNum ),
    m_ui16PDUTotal( PduTotal ),
    m_ui16CordSys( CS ),
    m_ui8NumAxis( 0 ),
    m_ui8ConstGrid( CG ),
    m_EnvType( ET ),
    m_Ori( Ori ),
    m_ui64SampleTime( SampleTime ),
    m_ui32TotalValues( 0 ),
    m_ui8VecDim( 0 ),
    m_ui16Padding1( 0 ),
    m_ui8Padding1( 0 )
{
    m_ui8ProtocolFamily = SyntheticEnvironment;
    m_ui8PDUType = GriddedData_PDU_Type;
    m_ui16PDULength = GRIDDED_DATA_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
}